

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptree_test.cpp
# Opt level: O0

pint tree_complexity(PTree *tree)

{
  int iVar1;
  pint pVar2;
  double dVar3;
  double dVar4;
  double phi;
  PTree *tree_local;
  
  if ((tree == (PTree *)0x0) || (iVar1 = p_tree_get_nnodes(tree), iVar1 == 0)) {
    return 0;
  }
  iVar1 = p_tree_get_type(tree);
  if (iVar1 == 0) {
    pVar2 = p_tree_get_nnodes(tree);
    return pVar2;
  }
  if (iVar1 != 1) {
    if (iVar1 != 2) {
      pVar2 = p_tree_get_nnodes(tree);
      return pVar2;
    }
    dVar3 = sqrt(5.0);
    dVar4 = sqrt(5.0);
    iVar1 = p_tree_get_nnodes(tree);
    dVar4 = log(dVar4 * (double)(iVar1 + 2));
    dVar3 = log((dVar3 + 1.0) / 2.0);
    return (int)(dVar4 / dVar3 - 2.0);
  }
  iVar1 = p_tree_get_nnodes(tree);
  dVar3 = log((double)iVar1 + 1.0);
  dVar4 = log(2.0);
  return (int)(dVar3 / dVar4) << 1;
}

Assistant:

static pint
tree_complexity (const PTree *tree)
{
	if (tree == NULL || p_tree_get_nnodes (tree) == 0)
		return 0;

	switch (p_tree_get_type (tree)) {
	case P_TREE_TYPE_BINARY:
		return p_tree_get_nnodes (tree);
	case P_TREE_TYPE_RB:
		return 2 * ((pint) (log ((double) p_tree_get_nnodes (tree) + 1) / log (2.0)));
	case P_TREE_TYPE_AVL:
	{
		double phi = (1 + sqrt (5.0)) / 2.0;
		return (pint) (log (sqrt (5.0) * (p_tree_get_nnodes (tree) + 2)) / log (phi) - 2);
	}
	default:
		return p_tree_get_nnodes (tree);
	}
}